

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrASL0x0a(CPU *this)

{
  uint8_t uVar1;
  CPU *in_RDI;
  
  uVar1 = ASL(in_RDI,in_RDI->A);
  in_RDI->A = uVar1;
  return 2;
}

Assistant:

int CPU::instrASL0x0a() {
	A = ASL(A);
	return 2;
}